

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O0

void __thiscall cmQtAutoGeneratorMocUic::MocGenerateCompilation(cmQtAutoGeneratorMocUic *this)

{
  string *filename;
  bool bVar1;
  MocSettingsT *pMVar2;
  BaseSettingsT *pBVar3;
  FileSystem *pFVar4;
  Logger *pLVar5;
  char local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  int local_c0;
  allocator<char> local_b9;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string *local_78;
  string *compAbs;
  string *mocfile;
  iterator __end3;
  iterator __begin3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined1 local_48 [5];
  char send;
  char sbeg;
  string content;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> mocLock;
  cmQtAutoGeneratorMocUic *this_local;
  
  mocLock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->JobsMutex_);
  if (((this->JobError_ & 1U) == 0) && (pMVar2 = Moc(this), (pMVar2->Enabled & 1U) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_48,"// This file is autogenerated. Changes will be overwritten.\n",
               (allocator<char> *)((long)&__range3 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->MocAutoFiles_);
    if (bVar1) {
      std::__cxx11::string::operator+=
                ((string *)local_48,
                 "// No files found that require moc or the moc files are included\n");
      std::__cxx11::string::operator+=
                ((string *)local_48,"enum some_compilers { need_more_than_nothing };\n");
    }
    else {
      pBVar3 = Base(this);
      __range3._6_1_ = '\"';
      if ((pBVar3->MultiConfig & 1U) != 0) {
        __range3._6_1_ = '<';
      }
      pBVar3 = Base(this);
      local_109 = '>';
      if ((pBVar3->MultiConfig & 1U) == 0) {
        local_109 = '\"';
      }
      __range3._5_1_ = local_109;
      __end3 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->MocAutoFiles_);
      mocfile = (string *)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&this->MocAutoFiles_);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&mocfile), bVar1) {
        compAbs = std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end3);
        std::__cxx11::string::operator+=((string *)local_48,"#include ");
        std::__cxx11::string::operator+=((string *)local_48,__range3._6_1_);
        std::__cxx11::string::operator+=((string *)local_48,(string *)compAbs);
        std::__cxx11::string::operator+=((string *)local_48,__range3._5_1_);
        std::__cxx11::string::operator+=((string *)local_48,'\n');
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3);
      }
    }
    pMVar2 = Moc(this);
    local_78 = &pMVar2->CompFileAbs;
    pFVar4 = cmQtAutoGenerator::FileSys(&this->super_cmQtAutoGenerator);
    bVar1 = cmQtAutoGenerator::FileSystem::FileDiffers(pFVar4,local_78,(string *)local_48);
    if (bVar1) {
      pLVar5 = cmQtAutoGenerator::Log(&this->super_cmQtAutoGenerator);
      bVar1 = cmQtAutoGenerator::Logger::Verbose(pLVar5);
      if (bVar1) {
        pLVar5 = cmQtAutoGenerator::Log(&this->super_cmQtAutoGenerator);
        std::operator+(&local_98,"Generating MOC compilation ",local_78);
        cmQtAutoGenerator::Logger::Info(pLVar5,MOC,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
      }
      pFVar4 = cmQtAutoGenerator::FileSys(&this->super_cmQtAutoGenerator);
      bVar1 = cmQtAutoGenerator::FileSystem::FileWrite(pFVar4,MOC,local_78,(string *)local_48);
      if (bVar1) goto LAB_0020452d;
      pLVar5 = cmQtAutoGenerator::Log(&this->super_cmQtAutoGenerator);
      filename = local_78;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"mocs compilation file writing failed",&local_b9);
      cmQtAutoGenerator::Logger::ErrorFile(pLVar5,MOC,filename,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      RegisterJobError(this);
      local_c0 = 1;
    }
    else {
      if ((this->MocAutoFileUpdated_ & 1U) != 0) {
        pLVar5 = cmQtAutoGenerator::Log(&this->super_cmQtAutoGenerator);
        bVar1 = cmQtAutoGenerator::Logger::Verbose(pLVar5);
        if (bVar1) {
          pLVar5 = cmQtAutoGenerator::Log(&this->super_cmQtAutoGenerator);
          std::operator+(&local_e0,"Touching mocs compilation ",local_78);
          cmQtAutoGenerator::Logger::Info(pLVar5,MOC,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
        }
        pFVar4 = cmQtAutoGenerator::FileSys(&this->super_cmQtAutoGenerator);
        cmQtAutoGenerator::FileSystem::Touch(pFVar4,local_78,false);
      }
LAB_0020452d:
      local_c0 = 0;
    }
    std::__cxx11::string::~string((string *)local_48);
    if (local_c0 != 0) goto LAB_00204586;
    Base(this);
  }
  local_c0 = 0;
LAB_00204586:
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void cmQtAutoGeneratorMocUic::MocGenerateCompilation()
{
  std::lock_guard<std::mutex> mocLock(JobsMutex_);
  if (!JobError_ && Moc().Enabled) {
    // Write mocs compilation build file
    {
      // Compose mocs compilation file content
      std::string content =
        "// This file is autogenerated. Changes will be overwritten.\n";
      if (MocAutoFiles_.empty()) {
        // Placeholder content
        content += "// No files found that require moc or the moc files are "
                   "included\n";
        content += "enum some_compilers { need_more_than_nothing };\n";
      } else {
        // Valid content
        char const sbeg = Base().MultiConfig ? '<' : '"';
        char const send = Base().MultiConfig ? '>' : '"';
        for (std::string const& mocfile : MocAutoFiles_) {
          content += "#include ";
          content += sbeg;
          content += mocfile;
          content += send;
          content += '\n';
        }
      }

      std::string const& compAbs = Moc().CompFileAbs;
      if (FileSys().FileDiffers(compAbs, content)) {
        // Actually write mocs compilation file
        if (Log().Verbose()) {
          Log().Info(GenT::MOC, "Generating MOC compilation " + compAbs);
        }
        if (!FileSys().FileWrite(GenT::MOC, compAbs, content)) {
          Log().ErrorFile(GenT::MOC, compAbs,
                          "mocs compilation file writing failed");
          RegisterJobError();
          return;
        }
      } else if (MocAutoFileUpdated_) {
        // Only touch mocs compilation file
        if (Log().Verbose()) {
          Log().Info(GenT::MOC, "Touching mocs compilation " + compAbs);
        }
        FileSys().Touch(compAbs);
      }
    }
    // Write mocs compilation wrapper file
    if (Base().MultiConfig) {
    }
  }
}